

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags flags)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiWindow *this;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiID id;
  ImGuiViewportP *pIVar6;
  ImVec2 IVar7;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  id = ImGuiWindow::GetID(this,name,(char *)0x0);
  bVar5 = IsPopupOpen(id,0);
  if (bVar5) {
    if (((pIVar3->NextWindowData).Flags & 1) == 0) {
      if (this->WasActive == true) {
        pIVar6 = this->Viewport;
      }
      else {
        pIVar6 = (ImGuiViewportP *)GetMainViewport();
      }
      pIVar4 = GImGui;
      IVar1 = (pIVar6->super_ImGuiViewport).Pos;
      IVar2 = (pIVar6->super_ImGuiViewport).Size;
      IVar7.x = IVar2.x * 0.5 + IVar1.x;
      IVar7.y = IVar2.y * 0.5 + IVar1.y;
      (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
      (pIVar4->NextWindowData).PosVal = IVar7;
      (pIVar4->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar4->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar4->NextWindowData).PosCond = 4;
      (pIVar4->NextWindowData).PosUndock = true;
    }
    bVar5 = Begin(name,p_open,flags | 0xc200020);
    if (bVar5) {
      if (p_open == (bool *)0x0) {
        return true;
      }
      if (*p_open != false) {
        return true;
      }
      EndPopup();
      ClosePopupToLevel((pIVar3->BeginPopupStack).Size,true);
    }
    else {
      EndPopup();
    }
  }
  else {
    (pIVar3->NextWindowData).Flags = 0;
  }
  return false;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }

    // Center modal windows by default for increased visibility
    // (this won't really last as settings will kick in, and is mostly for backward compatibility. user may do the same themselves)
    // FIXME: Should test for (PosCond & window->SetWindowPosAllowFlags) with the upcoming window.
    if ((g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) == 0)
    {
        const ImGuiViewport* viewport = window->WasActive ? window->Viewport : GetMainViewport(); // FIXME-VIEWPORT: What may be our reference viewport?
        SetNextWindowPos(viewport->GetCenter(), ImGuiCond_FirstUseEver, ImVec2(0.5f, 0.5f));
    }

    flags |= ImGuiWindowFlags_Popup | ImGuiWindowFlags_Modal | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoDocking;
    const bool is_open = Begin(name, p_open, flags);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        EndPopup();
        if (is_open)
            ClosePopupToLevel(g.BeginPopupStack.Size, true);
        return false;
    }
    return is_open;
}